

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O2

Instr * __thiscall
Inline::InlineGetterSetterFunction
          (Inline *this,Instr *accessorInstr,FunctionJITTimeInfo *inlineeData,
          StackSym *symCallerThis,uint inlineCacheIndex,bool isGetter,bool *pIsInlined,
          uint recursiveInlineDepth)

{
  ScriptContext *scriptContext;
  JITTimeWorkItem *this_00;
  Func *pFVar1;
  void *codeGenAllocators;
  ThreadContextInfo *pTVar2;
  code *pcVar3;
  char16_t *pcVar4;
  Instr *pIVar5;
  Instr *pIVar6;
  bool bVar7;
  ExecutionMode EVar8;
  bool bVar9;
  RegSlot RVar10;
  uint32 postCallByteCodeOffset;
  undefined4 *puVar11;
  Opnd *this_01;
  undefined4 extraout_var;
  CodeGenWorkItemIDL *workItemData;
  CodeGenWorkItemIDL *pCVar12;
  intptr_t funcBodyAddr;
  Func *this_02;
  FunctionJITTimeInfo *pFVar13;
  SymOpnd *pSVar14;
  PropertySym *pPVar15;
  char16 *pcVar16;
  char16 *pcVar17;
  PropertyRecord *pPVar18;
  PropertySymOpnd *methodOpnd;
  Instr *inlineBailoutChecksBeforeInstr;
  ThreadContext *this_03;
  Inline *pIVar19;
  undefined7 in_register_00000089;
  ulong uVar20;
  wchar local_188 [4];
  char16 debugStringBuffer2 [42];
  bool local_128 [8];
  bool safeThis;
  JITTimePolymorphicInlineCacheInfo *local_c8;
  JITTimeWorkItem *local_c0;
  ThreadContextInfo *local_b8;
  ScriptContextInfo *local_b0;
  JitArenaAllocator *local_a8;
  JITOutputIDL *local_a0;
  ScriptContextProfiler *local_98;
  Instr *local_90;
  StackSym *local_88;
  Inline *local_80;
  Func *local_78;
  FunctionJITTimeInfo *local_70;
  JITTimeFunctionBody *local_68;
  Instr *local_60;
  FunctionJITRuntimeInfo *local_58;
  undefined8 local_50;
  RegOpnd *local_48;
  JITTimeFunctionBody *local_40;
  char16 *local_38;
  
  local_38 = (char16 *)CONCAT44(local_38._4_4_,(int)CONCAT71(in_register_00000089,isGetter));
  local_58 = (FunctionJITRuntimeInfo *)CONCAT44(local_58._4_4_,inlineCacheIndex);
  if (this->topFunc->m_isBackgroundJIT == false) {
    scriptContext = (ScriptContext *)this->topFunc->m_scriptContextInfo;
    ThreadContext::ProbeStackNoDispose(scriptContext->threadContext,0xc00,scriptContext,(PVOID)0x0);
  }
  *pIsInlined = true;
  local_90 = accessorInstr->m_next;
  local_68 = Func::GetJITFunctionBody(accessorInstr->m_func);
  local_40 = FunctionJITTimeInfo::GetBody(inlineeData);
  if (accessorInstr->m_src2 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar11 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0xf90,"(!accessorInstr->GetSrc2())","!accessorInstr->GetSrc2()");
    if (!bVar7) goto LAB_004fe389;
    *puVar11 = 0;
  }
  local_88 = symCallerThis;
  local_60 = accessorInstr;
  if (((char)local_38 == '\0') || (accessorInstr->m_dst == (Opnd *)0x0)) {
    local_50 = 0xffffffffffffffff;
    local_48 = (RegOpnd *)0x0;
  }
  else {
    this_01 = IR::Instr::UnlinkDst(accessorInstr);
    local_48 = IR::Opnd::AsRegOpnd(this_01);
    RVar10 = StackSym::GetByteCodeRegSlot(local_48->m_sym);
    local_50 = CONCAT44(extraout_var,RVar10);
  }
  workItemData = (CodeGenWorkItemIDL *)
                 new<Memory::JitArenaAllocator>(0x60,this->topFunc->m_alloc,0x3d6ef4);
  bVar7 = Func::IsJitInDebugMode(this->topFunc);
  workItemData->isJitInDebugMode = bVar7;
  workItemData->type = '\0';
  EVar8 = JITTimeWorkItem::GetJitMode(this->topFunc->m_workItem);
  workItemData->jitMode = EVar8;
  pCVar12 = JITTimeWorkItem::GetWorkItemData(this->topFunc->m_workItem);
  workItemData->nativeDataAddr = pCVar12->nativeDataAddr;
  workItemData->loopNumber = 0xffffffff;
  workItemData->jitData = &inlineeData->m_data;
  local_c0 = (JITTimeWorkItem *)
             new<Memory::JitArenaAllocator>(0x1e0,this->topFunc->m_alloc,0x3d6ef4);
  JITTimeWorkItem::JITTimeWorkItem(local_c0,workItemData);
  this_00 = this->topFunc->m_workItem;
  funcBodyAddr = JITTimeFunctionBody::GetAddr(local_40);
  local_c8 = JITTimeWorkItem::GetInlineePolymorphicInlineCacheInfo(this_00,funcBodyAddr);
  this_02 = (Func *)new<Memory::JitArenaAllocator>(0x420,this->topFunc->m_alloc,0x3d6ef4);
  pFVar1 = this->topFunc;
  local_a8 = pFVar1->m_alloc;
  local_b8 = pFVar1->m_threadContextInfo;
  local_b0 = pFVar1->m_scriptContextInfo;
  local_a0 = JITOutput::GetOutputData(&pFVar1->m_output);
  pIVar6 = local_60;
  pFVar13 = JITTimeWorkItem::GetJITTimeInfo(local_60->m_func->m_workItem);
  local_58 = FunctionJITTimeInfo::GetLdFldInlineeRuntimeData(pFVar13,(InlineCacheIndex)local_58);
  pFVar1 = this->topFunc;
  local_98 = pFVar1->m_codeGenProfiler;
  codeGenAllocators = pFVar1->topFunc->m_codeGenAllocators;
  bVar7 = pFVar1->m_isBackgroundJIT;
  pFVar1 = pIVar6->m_func;
  local_80 = this;
  postCallByteCodeOffset = IR::Instr::GetByteCodeOffset(pIVar6->m_next);
  local_78 = this_02;
  Func::Func(this_02,local_a8,local_c0,local_b8,local_b0,local_a0,(EntryPointInfo *)0x0,local_58,
             local_c8,codeGenAllocators,local_98,bVar7,pFVar1,postCallByteCodeOffset,
             (RegSlot)local_50,false,0xffff,true);
  bVar9 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,InlinePhase);
  bVar7 = (bool)(char)local_38;
  uVar20 = (ulong)local_38 & 0xff;
  local_70 = inlineeData;
  if (bVar9) {
LAB_004fe18e:
    pIVar6 = local_60;
    pcVar4 = L"es5Setter";
    if ((char)local_38 != '\0') {
      pcVar4 = L"es5Getter";
    }
    pSVar14 = IR::Opnd::AsSymOpnd((&local_60->m_dst)[uVar20]);
    pPVar15 = Sym::AsPropertySym(pSVar14->m_sym);
    local_38 = JITTimeFunctionBody::GetDisplayName(local_40);
    local_40 = (JITTimeFunctionBody *)
               FunctionJITTimeInfo::GetDebugNumberSet(inlineeData,(wchar (*) [42])local_128);
    pcVar16 = JITTimeFunctionBody::GetDisplayName(local_68);
    pFVar13 = JITTimeWorkItem::GetJITTimeInfo(pIVar6->m_func->m_workItem);
    pcVar17 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar13,(wchar (*) [42])local_188);
    pTVar2 = pPVar15->m_func->m_threadContextInfo;
    this_03 = (ThreadContext *)pTVar2[-3].wellKnownHostTypeIds;
    if (pTVar2 == (ThreadContextInfo *)0x0) {
      this_03 = (ThreadContext *)0x0;
    }
    pPVar18 = ThreadContext::GetPropertyRecord(this_03,pPVar15->m_propertyId);
    Output::Print(L"INLINING: %s: \tInlinee: %s (%s)\tCaller: %s (%s)\t fieldName: %s\n",pcVar4 + 3,
                  local_38,local_40,pcVar16,pcVar17,pPVar18 + 1);
    Output::Flush();
  }
  else {
    bVar9 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,InlineAccessorsPhase);
    if (bVar9) goto LAB_004fe18e;
    bVar9 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,InlineAccessorsPhase);
    if (bVar9) goto LAB_004fe18e;
  }
  pIVar6 = local_60;
  pIVar19 = (Inline *)(&local_60->m_dst)[uVar20];
  bVar9 = IR::Opnd::IsSymOpnd((Opnd *)pIVar19);
  if (bVar9) {
    pSVar14 = IR::Opnd::AsSymOpnd((Opnd *)pIVar19);
    bVar9 = IR::SymOpnd::IsPropertySymOpnd(pSVar14);
    if (bVar9) goto LAB_004fe2d9;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  *puVar11 = 1;
  bVar9 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                     ,0xff7,
                     "(methodOpnd->IsSymOpnd() && methodOpnd->AsSymOpnd()->IsPropertySymOpnd())",
                     "methodOpnd->IsSymOpnd() && methodOpnd->AsSymOpnd()->IsPropertySymOpnd()");
  if (!bVar9) {
LAB_004fe389:
    pcVar3 = (code *)invalidInstructionException();
    (*pcVar3)();
  }
  *puVar11 = 0;
LAB_004fe2d9:
  methodOpnd = IR::Opnd::AsPropertySymOpnd((Opnd *)pIVar19);
  inlineBailoutChecksBeforeInstr =
       SimulateCallForGetterSetter(pIVar19,pIVar6,pIVar6,methodOpnd,bVar7);
  pFVar13 = local_70;
  pIVar19 = local_80;
  local_128[0] = false;
  TryOptimizeCallInstrWithFixedMethod
            (local_80,pIVar6,local_70,false,false,false,true,local_128,false,0);
  pIVar5 = local_90;
  InlineFunctionCommon
            (pIVar19,pIVar6,false,(StackSym *)0x0,pFVar13,local_78,local_90,local_48,
             inlineBailoutChecksBeforeInstr,local_88,recursiveInlineDepth,local_128[0],false);
  return pIVar5;
}

Assistant:

IR::Instr *
Inline::InlineGetterSetterFunction(IR::Instr *accessorInstr, const FunctionJITTimeInfo *const inlineeData, const StackSym *symCallerThis, const uint inlineCacheIndex, bool isGetter, bool *pIsInlined, uint recursiveInlineDepth)
{
    // This function is recursive, so when jitting in the foreground, probe the stack
    if (!this->topFunc->IsBackgroundJIT())
    {
        PROBE_STACK_NO_DISPOSE(this->topFunc->GetScriptContext(), Js::Constants::MinStackDefault);
    }

    *pIsInlined = true;
    IR::Instr *instrNext = accessorInstr->m_next;

    const JITTimeFunctionBody *funcCaller = accessorInstr->m_func->GetJITFunctionBody();
    JITTimeFunctionBody *funcBody = inlineeData->GetBody();

    Assert(!accessorInstr->GetSrc2());

    JS_ETW(EventWriteJSCRIPT_BACKEND_INLINE(
        funcCaller->GetFunctionNumber(), funcBody->GetFunctionNumber(),
        funcCaller->GetDisplayName(), funcBody->GetDisplayName()));

    IR::Instr *inlineBailoutChecksBeforeInstr = accessorInstr;


    IR::RegOpnd * returnValueOpnd;
    Js::RegSlot returnRegSlot;
    if (isGetter && accessorInstr->GetDst())
    {
        returnValueOpnd = accessorInstr->UnlinkDst()->AsRegOpnd();
        returnRegSlot = returnValueOpnd->m_sym->GetByteCodeRegSlot();
    }
    else
    {
        returnValueOpnd = nullptr;
        returnRegSlot = Js::Constants::NoRegister;
    }

    // inlinee
    CodeGenWorkItemIDL * workItemData = JitAnewStruct(this->topFunc->m_alloc, CodeGenWorkItemIDL);

    workItemData->isJitInDebugMode = this->topFunc->IsJitInDebugMode();
    workItemData->type = JsFunctionType;
    workItemData->jitMode = static_cast<char>(this->topFunc->GetWorkItem()->GetJitMode());
    workItemData->nativeDataAddr = this->topFunc->GetWorkItem()->GetWorkItemData()->nativeDataAddr;
    workItemData->loopNumber = Js::LoopHeader::NoLoop;

    workItemData->jitData = (FunctionJITTimeDataIDL*)(inlineeData);
    JITTimeWorkItem * jitWorkItem = JitAnew(this->topFunc->m_alloc, JITTimeWorkItem, workItemData);

    JITTimePolymorphicInlineCacheInfo * entryPointPolymorphicInlineCacheInfo = this->topFunc->GetWorkItem()->GetInlineePolymorphicInlineCacheInfo(funcBody->GetAddr());
#if !FLOATVAR
    Func * inlinee = JitAnew(this->topFunc->m_alloc,
        Func,
        this->topFunc->m_alloc,
        jitWorkItem,
        this->topFunc->GetThreadContextInfo(),
        this->topFunc->GetScriptContextInfo(),
        this->topFunc->GetJITOutput()->GetOutputData(),
        nullptr,
        accessorInstr->m_func->GetWorkItem()->GetJITTimeInfo()->GetLdFldInlineeRuntimeData(inlineCacheIndex),
        entryPointPolymorphicInlineCacheInfo,
        this->topFunc->GetCodeGenAllocators(),
        this->topFunc->GetNumberAllocator(),
        this->topFunc->GetCodeGenProfiler(),
        this->topFunc->IsBackgroundJIT(),
        accessorInstr->m_func,
        accessorInstr->m_next->GetByteCodeOffset(),
        returnRegSlot,
        false,
        UINT16_MAX,
        true);
#else
    Func * inlinee = JitAnew(this->topFunc->m_alloc,
        Func,
        this->topFunc->m_alloc,
        jitWorkItem,
        this->topFunc->GetThreadContextInfo(),
        this->topFunc->GetScriptContextInfo(),
        this->topFunc->GetJITOutput()->GetOutputData(),
        nullptr,
        accessorInstr->m_func->GetWorkItem()->GetJITTimeInfo()->GetLdFldInlineeRuntimeData(inlineCacheIndex),
        entryPointPolymorphicInlineCacheInfo,
        this->topFunc->GetCodeGenAllocators(),
        this->topFunc->GetCodeGenProfiler(),
        this->topFunc->IsBackgroundJIT(),
        accessorInstr->m_func,
        accessorInstr->m_next->GetByteCodeOffset(),
        returnRegSlot,
        false,
        UINT16_MAX,
        true);
#endif

    // funcBody->GetInParamsCount() can be greater than one even if it is all undefined. Example defineProperty(a,"foo", {get:function(a,b,c){}});

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
    if (Js::Configuration::Global.flags.TestTrace.IsEnabled(Js::InlinePhase) ||
        Js::Configuration::Global.flags.TestTrace.IsEnabled(Js::InlineAccessorsPhase) || Js::Configuration::Global.flags.Trace.IsEnabled(Js::InlineAccessorsPhase))
    {
        char16 debugStringBuffer [MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
        char16 debugStringBuffer2[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
        PropertySym *propertySym = isGetter ? accessorInstr->GetSrc1()->AsSymOpnd()->m_sym->AsPropertySym() : accessorInstr->GetDst()->AsSymOpnd()->m_sym->AsPropertySym();
        if (JITManager::GetJITManager()->IsOOPJITEnabled())
        {
            Output::Print(_u("INLINING: %s: \tInlinee: %s (%s)\tCaller: %s (%s)\t fieldId: %d\n"), isGetter ? _u("Getter") : _u("Setter"),
                funcBody->GetDisplayName(), inlineeData->GetDebugNumberSet(debugStringBuffer), funcCaller->GetDisplayName(), accessorInstr->m_func->GetWorkItem()->GetJITTimeInfo()->GetDebugNumberSet(debugStringBuffer2),
                propertySym->m_propertyId);
        }
        else
        {
            Output::Print(_u("INLINING: %s: \tInlinee: %s (%s)\tCaller: %s (%s)\t fieldName: %s\n"), isGetter ? _u("Getter") : _u("Setter"),
                funcBody->GetDisplayName(), inlineeData->GetDebugNumberSet(debugStringBuffer), funcCaller->GetDisplayName(), accessorInstr->m_func->GetWorkItem()->GetJITTimeInfo()->GetDebugNumberSet(debugStringBuffer2),
                propertySym->GetFunc()->GetInProcThreadContext()->GetPropertyRecord(propertySym->m_propertyId)->GetBuffer());
        }
        Output::Flush();
    }
#endif
    IR::Opnd * methodOpnd = isGetter ? accessorInstr->GetSrc1() : accessorInstr->GetDst();
    Assert(methodOpnd->IsSymOpnd() && methodOpnd->AsSymOpnd()->IsPropertySymOpnd());

    inlineBailoutChecksBeforeInstr = SimulateCallForGetterSetter(accessorInstr, accessorInstr, methodOpnd->AsPropertySymOpnd(), isGetter);

    bool safeThis = false;
    TryOptimizeCallInstrWithFixedMethod(accessorInstr, inlineeData, false, false, false, true, safeThis);

    return InlineFunctionCommon(accessorInstr, false, nullptr, inlineeData, inlinee, instrNext, returnValueOpnd, inlineBailoutChecksBeforeInstr, symCallerThis, recursiveInlineDepth, safeThis);
}